

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

AActor * P_BlockmapSearch(AActor *mo,int distance,_func_AActor_ptr_AActor_ptr_int_void_ptr *check,
                         void *params)

{
  int iVar1;
  int iVar2;
  AActor *pAVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [16];
  
  iVar13 = (int)(((mo->__Pos).X - bmaporgx) * 0.0078125);
  iVar14 = (int)(((mo->__Pos).Y - bmaporgy) * 0.0078125);
  validcount = validcount + 1;
  if ((((iVar13 < 0) ||
       (auVar15._0_4_ = -(uint)(iVar13 < bmapwidth), auVar15._4_4_ = -(uint)(iVar13 < bmapwidth),
       auVar15._8_4_ = -(uint)(iVar14 < bmapheight), auVar15._12_4_ = -(uint)(iVar14 < bmapheight),
       uVar5 = movmskpd(0x17eee04,auVar15),
       (byte)((byte)uVar5 >> 1 & -1 < iVar14 & (byte)uVar5) != 1)) ||
      (pAVar3 = (*check)(mo,bmapwidth * iVar14 + iVar13,params), pAVar3 == (AActor *)0x0)) &&
     (pAVar3 = (AActor *)0x0, 0 < distance)) {
    iVar9 = 1;
    do {
      iVar1 = bmapwidth;
      iVar4 = iVar13 - iVar9;
      iVar11 = bmapwidth + -1;
      iVar7 = iVar11;
      if (iVar4 < iVar11) {
        iVar7 = iVar4;
      }
      if (iVar4 < 1) {
        iVar7 = 0;
      }
      iVar6 = iVar14 - iVar9;
      iVar4 = bmapheight + -1;
      iVar8 = iVar4;
      if (iVar6 < iVar4) {
        iVar8 = iVar6;
      }
      if (iVar6 < 1) {
        iVar8 = 0;
      }
      iVar6 = iVar9 + iVar13;
      if ((-1 < iVar6) && (iVar10 = iVar9 + iVar14, -1 < iVar10)) {
        iVar2 = iVar8 * bmapwidth + iVar7;
        if (iVar6 < bmapwidth) {
          iVar11 = iVar6;
        }
        if (iVar10 < bmapheight) {
          iVar4 = iVar10;
        }
        iVar6 = iVar2;
        if (iVar7 <= iVar11) {
          iVar6 = iVar8 * bmapwidth + iVar11;
          if (iVar6 < iVar2) {
            iVar6 = iVar2;
          }
          iVar6 = iVar6 + 1;
          iVar8 = iVar2;
          do {
            pAVar3 = (*check)(mo,iVar8,params);
            if (pAVar3 != (AActor *)0x0) {
              return pAVar3;
            }
            iVar8 = iVar8 + 1;
          } while (iVar6 != iVar8);
        }
        for (iVar6 = iVar6 + -1; iVar6 <= iVar11 + iVar4 * iVar1; iVar6 = iVar6 + bmapwidth) {
          pAVar3 = (*check)(mo,iVar6,params);
          if (pAVar3 != (AActor *)0x0) {
            return pAVar3;
          }
        }
        iVar6 = iVar6 - bmapwidth;
        iVar7 = iVar4 * iVar1 + iVar7;
        iVar11 = iVar6;
        if (iVar7 <= iVar6) {
          do {
            pAVar3 = (*check)(mo,iVar11,params);
            if (pAVar3 != (AActor *)0x0) {
              return pAVar3;
            }
            iVar6 = iVar11 + -1;
            bVar12 = iVar7 < iVar11;
            iVar11 = iVar6;
          } while (bVar12);
        }
        if (iVar2 <= iVar6) {
          iVar6 = iVar6 + 1;
          do {
            pAVar3 = (*check)(mo,iVar6,params);
            if (pAVar3 != (AActor *)0x0) {
              return pAVar3;
            }
            iVar6 = iVar6 - bmapwidth;
          } while (iVar2 < iVar6);
        }
      }
      bVar12 = iVar9 != distance;
      pAVar3 = (AActor *)0x0;
      iVar9 = iVar9 + 1;
    } while (bVar12);
  }
  return pAVar3;
}

Assistant:

AActor *P_BlockmapSearch (AActor *mo, int distance, AActor *(*check)(AActor*, int, void *), void *params)
{
	int blockX;
	int blockY;
	int startX, startY;
	int blockIndex;
	int firstStop;
	int secondStop;
	int thirdStop;
	int finalStop;
	int count;
	AActor *target;

	startX = GetBlockX(mo->X());
	startY = GetBlockY(mo->Y());
	validcount++;
	
	if (startX >= 0 && startX < bmapwidth && startY >= 0 && startY < bmapheight)
	{
		if ( (target = check (mo, startY*bmapwidth+startX, params)) )
		{ // found a target right away
			return target;
		}
	}
	for (count = 1; count <= distance; count++)
	{
		blockX = clamp (startX-count, 0, bmapwidth-1);
		blockY = clamp (startY-count, 0, bmapheight-1);

		blockIndex = blockY*bmapwidth+blockX;
		firstStop = startX+count;
		if (firstStop < 0)
		{
			continue;
		}
		if (firstStop >= bmapwidth)
		{
			firstStop = bmapwidth-1;
		}
		secondStop = startY+count;
		if (secondStop < 0)
		{
			continue;
		}
		if (secondStop >= bmapheight)
		{
			secondStop = bmapheight-1;
		}
		thirdStop = secondStop*bmapwidth+blockX;
		secondStop = secondStop*bmapwidth+firstStop;
		firstStop += blockY*bmapwidth;
		finalStop = blockIndex;		

		// Trace the first block section (along the top)
		for (; blockIndex <= firstStop; blockIndex++)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
		// Trace the second block section (right edge)
		for (blockIndex--; blockIndex <= secondStop; blockIndex += bmapwidth)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}		
		// Trace the third block section (bottom edge)
		for (blockIndex -= bmapwidth; blockIndex >= thirdStop; blockIndex--)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
		// Trace the final block section (left edge)
		for (blockIndex++; blockIndex > finalStop; blockIndex -= bmapwidth)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
	}
	return NULL;	
}